

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_ParseCommandLineFlagsAndDashArgs_TwoDashArgFirst::Run(void)

{
  uint uVar1;
  int32 iVar2;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver local_10;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsAndDashArgs","TwoDashArgFirst");
  uVar1 = ParseTestFlag(true,3,&PTR_anon_var_dwarf_1dfb1_0015ac50);
  _GLOBAL__N_1::Test_ParseCommandLineFlagsAndDashArgs_TwoDashArgFirst::Run
            ((Test_ParseCommandLineFlagsAndDashArgs_TwoDashArgFirst *)(ulong)uVar1);
  iVar2 = ParseTestFlag(false,3,&PTR_anon_var_dwarf_1dfb1_0015ac50);
  if (iVar2 == -1) {
    FlagSaver::~FlagSaver(&local_10);
    return;
  }
  _GLOBAL__N_1::Test_ParseCommandLineFlagsAndDashArgs_TwoDashArgFirst::Run();
  FlagSaver::~FlagSaver(&local_10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(ParseCommandLineFlagsAndDashArgs, TwoDashArgFirst) {
  const char* argv[] = {
    "my_test",
    "--",
    "--test_flag=0",
    NULL,
  };

  EXPECT_EQ(-1, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(-1, ParseTestFlag(false, arraysize(argv) - 1, argv));
}